

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O3

bool slang::ast::FmtHelpers::checkDisplayArgs(ASTContext *context,Args *args)

{
  StringLiteral *arg;
  Type *this;
  bool bVar1;
  Diagnostic *diag;
  iterator local_38;
  
  if ((args->_M_extent)._M_extent_value != 0) {
    local_38._M_current = args->_M_ptr;
    do {
      arg = (StringLiteral *)*local_38._M_current;
      local_38._M_current = local_38._M_current + 1;
      bVar1 = Expression::bad((Expression *)arg);
      if (bVar1) {
        return false;
      }
      if ((arg->super_Expression).kind == StringLiteral) {
        bVar1 = checkFormatString(context,arg,&local_38,
                                  (iterator)(args->_M_ptr + (args->_M_extent)._M_extent_value));
        if (!bVar1) {
          return false;
        }
      }
      else {
        this = (arg->super_Expression).type.ptr;
        bVar1 = Type::isAggregate(this);
        if ((bVar1) && (bVar1 = Type::isByteArray(this), !bVar1)) {
          diag = ASTContext::addDiag(context,(DiagCode)0x17000b,(arg->super_Expression).sourceRange)
          ;
          ast::operator<<(diag,this);
          return false;
        }
      }
    } while (local_38._M_current != args->_M_ptr + (args->_M_extent)._M_extent_value);
  }
  return true;
}

Assistant:

bool FmtHelpers::checkDisplayArgs(const ASTContext& context, const Args& args) {
    auto argIt = args.begin();
    while (argIt != args.end()) {
        auto arg = *argIt++;
        if (arg->bad())
            return false;

        // Handle string literals as format strings.
        if (arg->kind == ExpressionKind::StringLiteral) {
            if (!checkFormatString(context, arg->as<StringLiteral>(), argIt, args.end()))
                return false;
        }
        else {
            const Type& type = *arg->type;
            if (type.isAggregate() && !type.isByteArray()) {
                context.addDiag(diag::FormatUnspecifiedType, arg->sourceRange) << type;
                return false;
            }
        }
    }

    return true;
}